

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolHashArray.c
# Opt level: O0

int * deTestHashArrayHash_find(deTestHashArrayHash *hash,deInt16 key)

{
  deUint32 dVar1;
  deBool dVar2;
  int local_2c;
  deTestHashArrayHashSlot *pdStack_28;
  int elemNdx;
  deTestHashArrayHashSlot *slot;
  int slotNdx;
  deInt16 key_local;
  deTestHashArrayHash *hash_local;
  
  if (0 < hash->numElements) {
    dVar1 = deInt16Hash(key);
    for (pdStack_28 = hash->slotTable[(int)(dVar1 & hash->slotTableSize - 1U)];
        pdStack_28 != (deTestHashArrayHashSlot *)0x0; pdStack_28 = pdStack_28->nextSlot) {
      for (local_2c = 0; local_2c < pdStack_28->numUsed; local_2c = local_2c + 1) {
        dVar2 = deInt16Equal(pdStack_28->keys[local_2c],key);
        if (dVar2 != 0) {
          return pdStack_28->values + local_2c;
        }
      }
    }
  }
  return (int *)0x0;
}

Assistant:

void dePoolHashArray_selfTest (void)
{
	deMemPool*			pool		= deMemPool_createRoot(DE_NULL, 0);
	deTestHashArray*	hashArray	= deTestHashArray_create(pool);
	deInt16Array*		keyArray	= deInt16Array_create(pool);
	deIntArray*			valueArray	= deIntArray_create(pool);
	int					iter;

	for (iter = 0; iter < 3; iter++)
	{
		int i;

		/* Insert a bunch of values. */
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 0);
		for (i = 0; i < 20; i++)
		{
			deTestHashArray_insert(hashArray, (deInt16)(-i^0x5), 2*i+5);
		}
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 20);

		deTestHashArray_copyToArray(hashArray, keyArray, DE_NULL);
		deTestHashArray_copyToArray(hashArray, DE_NULL, valueArray);
		DE_TEST_ASSERT(deInt16Array_getNumElements(keyArray) == 20);
		DE_TEST_ASSERT(deIntArray_getNumElements(valueArray) == 20);

		for (i = 0; i < 20; i++)
		{
			DE_TEST_ASSERT(deInt16Array_get(keyArray, i) == (deInt16)(-i^0x5));
			DE_TEST_ASSERT(deIntArray_get(valueArray, i) == 2*i+5);
		}

		deTestHashArray_reset(hashArray);
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 0);

		deTestHashArray_copyToArray(hashArray, keyArray, DE_NULL);
		deTestHashArray_copyToArray(hashArray, DE_NULL, valueArray);

		DE_TEST_ASSERT(deInt16Array_getNumElements(keyArray) == 0);
		DE_TEST_ASSERT(deIntArray_getNumElements(valueArray) == 0);
	}

	deMemPool_destroy(pool);
}